

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::Maybe<kj::HttpServer::SuspendedRequest>::Maybe
          (Maybe<kj::HttpServer::SuspendedRequest> *this,
          Maybe<kj::HttpServer::SuspendedRequest> *other)

{
  kj::_::NullableValue<kj::HttpServer::SuspendedRequest>::NullableValue(&this->ptr,&other->ptr);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }